

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ulong uVar44;
  byte bVar45;
  int iVar46;
  uint uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  bool bVar54;
  float fVar55;
  float fVar60;
  float fVar61;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  vint4 bi;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  undefined1 auVar91 [16];
  uint uVar93;
  uint uVar94;
  undefined1 auVar92 [16];
  uint uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined1 local_a28 [16];
  long local_a10;
  long local_a08;
  ulong local_a00;
  NodeRef *local_9f8;
  undefined1 (*local_9f0) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_9f8 = stack + 1;
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar84._4_4_ = uVar2;
  auVar84._0_4_ = uVar2;
  auVar84._8_4_ = uVar2;
  auVar84._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar86._4_4_ = uVar2;
  auVar86._0_4_ = uVar2;
  auVar86._8_4_ = uVar2;
  auVar86._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar88._4_4_ = uVar2;
  auVar88._0_4_ = uVar2;
  auVar88._8_4_ = uVar2;
  auVar88._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a00 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = local_a00 ^ 0x10;
  iVar46 = (tray->tnear).field_0.i[k];
  auVar91._4_4_ = iVar46;
  auVar91._0_4_ = iVar46;
  auVar91._8_4_ = iVar46;
  auVar91._12_4_ = iVar46;
  iVar46 = (tray->tfar).field_0.i[k];
  auVar92._4_4_ = iVar46;
  auVar92._0_4_ = iVar46;
  auVar92._8_4_ = iVar46;
  auVar92._12_4_ = iVar46;
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar54 = true;
  do {
    uVar52 = local_9f8[-1].ptr;
    local_9f8 = local_9f8 + -1;
    while ((uVar52 & 8) == 0) {
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + local_a00),auVar84);
      auVar56._0_4_ = fVar3 * auVar57._0_4_;
      auVar56._4_4_ = fVar3 * auVar57._4_4_;
      auVar56._8_4_ = fVar3 * auVar57._8_4_;
      auVar56._12_4_ = fVar3 * auVar57._12_4_;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + uVar49),auVar86);
      auVar63._0_4_ = fVar4 * auVar57._0_4_;
      auVar63._4_4_ = fVar4 * auVar57._4_4_;
      auVar63._8_4_ = fVar4 * auVar57._8_4_;
      auVar63._12_4_ = fVar4 * auVar57._12_4_;
      auVar57 = vpmaxsd_avx(auVar56,auVar63);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + uVar53),auVar88);
      auVar64._0_4_ = fVar5 * auVar56._0_4_;
      auVar64._4_4_ = fVar5 * auVar56._4_4_;
      auVar64._8_4_ = fVar5 * auVar56._8_4_;
      auVar64._12_4_ = fVar5 * auVar56._12_4_;
      auVar56 = vpmaxsd_avx(auVar64,auVar91);
      auVar57 = vpmaxsd_avx(auVar57,auVar56);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + uVar51),auVar84);
      auVar65._0_4_ = fVar3 * auVar56._0_4_;
      auVar65._4_4_ = fVar3 * auVar56._4_4_;
      auVar65._8_4_ = fVar3 * auVar56._8_4_;
      auVar65._12_4_ = fVar3 * auVar56._12_4_;
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + (uVar49 ^ 0x10)),auVar86);
      auVar75._0_4_ = fVar4 * auVar56._0_4_;
      auVar75._4_4_ = fVar4 * auVar56._4_4_;
      auVar75._8_4_ = fVar4 * auVar56._8_4_;
      auVar75._12_4_ = fVar4 * auVar56._12_4_;
      auVar56 = vpminsd_avx(auVar65,auVar75);
      auVar63 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + (uVar53 ^ 0x10)),auVar88);
      auVar76._0_4_ = fVar5 * auVar63._0_4_;
      auVar76._4_4_ = fVar5 * auVar63._4_4_;
      auVar76._8_4_ = fVar5 * auVar63._8_4_;
      auVar76._12_4_ = fVar5 * auVar63._12_4_;
      auVar63 = vpminsd_avx(auVar76,auVar92);
      auVar56 = vpminsd_avx(auVar56,auVar63);
      auVar57 = vpcmpgtd_avx(auVar57,auVar56);
      iVar46 = vmovmskps_avx(auVar57);
      if (iVar46 == 0xf) {
        bVar54 = local_9f8 != stack;
        goto joined_r0x003102fb;
      }
      bVar45 = (byte)iVar46 ^ 0xf;
      uVar44 = uVar52 & 0xfffffffffffffff0;
      lVar48 = 0;
      if (bVar45 != 0) {
        for (; (bVar45 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
        }
      }
      uVar52 = *(ulong *)(uVar44 + lVar48 * 8);
      uVar47 = bVar45 - 1 & (uint)bVar45;
      if (uVar47 != 0) {
        local_9f8->ptr = uVar52;
        local_9f8 = local_9f8 + 1;
        lVar48 = 0;
        if (uVar47 != 0) {
          for (; (uVar47 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
          }
        }
        uVar52 = *(ulong *)(uVar44 + lVar48 * 8);
        uVar47 = uVar47 - 1 & uVar47;
        uVar50 = (ulong)uVar47;
        if (uVar47 != 0) {
          do {
            local_9f8->ptr = uVar52;
            local_9f8 = local_9f8 + 1;
            lVar48 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
              }
            }
            uVar52 = *(ulong *)(uVar44 + lVar48 * 8);
            uVar50 = uVar50 & uVar50 - 1;
          } while (uVar50 != 0);
        }
      }
    }
    local_a08 = (ulong)((uint)uVar52 & 0xf) - 8;
    if (local_a08 != 0) {
      uVar52 = uVar52 & 0xfffffffffffffff0;
      local_a10 = 0;
      do {
        lVar48 = local_a10 * 0xb0;
        pfVar1 = (float *)(uVar52 + 0x80 + lVar48);
        fVar20 = *pfVar1;
        fVar21 = pfVar1[1];
        fVar22 = pfVar1[2];
        fVar23 = pfVar1[3];
        pfVar1 = (float *)(uVar52 + 0x40 + lVar48);
        fVar24 = *pfVar1;
        fVar25 = pfVar1[1];
        fVar26 = pfVar1[2];
        fVar27 = pfVar1[3];
        auVar57._0_4_ = fVar20 * fVar24;
        auVar57._4_4_ = fVar21 * fVar25;
        auVar57._8_4_ = fVar22 * fVar26;
        auVar57._12_4_ = fVar23 * fVar27;
        pfVar1 = (float *)(uVar52 + 0x70 + lVar48);
        fVar28 = *pfVar1;
        fVar29 = pfVar1[1];
        fVar30 = pfVar1[2];
        fVar31 = pfVar1[3];
        pfVar1 = (float *)(uVar52 + 0x50 + lVar48);
        fVar32 = *pfVar1;
        fVar33 = pfVar1[1];
        fVar34 = pfVar1[2];
        fVar35 = pfVar1[3];
        auVar66._0_4_ = fVar28 * fVar32;
        auVar66._4_4_ = fVar29 * fVar33;
        auVar66._8_4_ = fVar30 * fVar34;
        auVar66._12_4_ = fVar31 * fVar35;
        local_898 = vsubps_avx(auVar66,auVar57);
        pfVar1 = (float *)(uVar52 + 0x60 + lVar48);
        fVar36 = *pfVar1;
        fVar37 = pfVar1[1];
        fVar38 = pfVar1[2];
        fVar39 = pfVar1[3];
        auVar67._0_4_ = fVar36 * fVar32;
        auVar67._4_4_ = fVar37 * fVar33;
        auVar67._8_4_ = fVar38 * fVar34;
        auVar67._12_4_ = fVar39 * fVar35;
        pfVar1 = (float *)(uVar52 + 0x30 + lVar48);
        fVar40 = *pfVar1;
        fVar41 = pfVar1[1];
        fVar42 = pfVar1[2];
        fVar43 = pfVar1[3];
        auVar77._0_4_ = fVar20 * fVar40;
        auVar77._4_4_ = fVar21 * fVar41;
        auVar77._8_4_ = fVar22 * fVar42;
        auVar77._12_4_ = fVar23 * fVar43;
        auVar64 = vsubps_avx(auVar77,auVar67);
        auVar78._0_4_ = fVar28 * fVar40;
        auVar78._4_4_ = fVar29 * fVar41;
        auVar78._8_4_ = fVar30 * fVar42;
        auVar78._12_4_ = fVar31 * fVar43;
        auVar96._0_4_ = fVar36 * fVar24;
        auVar96._4_4_ = fVar37 * fVar25;
        auVar96._8_4_ = fVar38 * fVar26;
        auVar96._12_4_ = fVar39 * fVar27;
        auVar65 = vsubps_avx(auVar96,auVar78);
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar97._4_4_ = uVar2;
        auVar97._0_4_ = uVar2;
        auVar97._8_4_ = uVar2;
        auVar97._12_4_ = uVar2;
        auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + lVar48),auVar97);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar98._4_4_ = uVar2;
        auVar98._0_4_ = uVar2;
        auVar98._8_4_ = uVar2;
        auVar98._12_4_ = uVar2;
        auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x10 + lVar48),auVar98);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar99._4_4_ = uVar2;
        auVar99._0_4_ = uVar2;
        auVar99._8_4_ = uVar2;
        auVar99._12_4_ = uVar2;
        auVar63 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + lVar48),auVar99);
        fVar6 = *(float *)(ray + k * 4 + 0x50);
        fVar60 = *(float *)(ray + k * 4 + 0x60);
        fVar62 = auVar63._0_4_;
        auVar100._0_4_ = fVar6 * fVar62;
        fVar11 = auVar63._4_4_;
        auVar100._4_4_ = fVar6 * fVar11;
        fVar14 = auVar63._8_4_;
        auVar100._8_4_ = fVar6 * fVar14;
        fVar17 = auVar63._12_4_;
        auVar100._12_4_ = fVar6 * fVar17;
        fVar90 = auVar56._0_4_;
        auVar101._0_4_ = fVar60 * fVar90;
        fVar12 = auVar56._4_4_;
        auVar101._4_4_ = fVar60 * fVar12;
        fVar15 = auVar56._8_4_;
        auVar101._8_4_ = fVar60 * fVar15;
        fVar18 = auVar56._12_4_;
        auVar101._12_4_ = fVar60 * fVar18;
        auVar56 = vsubps_avx(auVar101,auVar100);
        fVar61 = *(float *)(ray + k * 4 + 0x40);
        fVar55 = auVar57._0_4_;
        auVar58._0_4_ = fVar60 * fVar55;
        fVar13 = auVar57._4_4_;
        auVar58._4_4_ = fVar60 * fVar13;
        fVar16 = auVar57._8_4_;
        auVar58._8_4_ = fVar60 * fVar16;
        fVar19 = auVar57._12_4_;
        auVar58._12_4_ = fVar60 * fVar19;
        auVar68._0_4_ = fVar61 * fVar62;
        auVar68._4_4_ = fVar61 * fVar11;
        auVar68._8_4_ = fVar61 * fVar14;
        auVar68._12_4_ = fVar61 * fVar17;
        auVar63 = vsubps_avx(auVar68,auVar58);
        auVar69._0_4_ = fVar61 * fVar90;
        auVar69._4_4_ = fVar61 * fVar12;
        auVar69._8_4_ = fVar61 * fVar15;
        auVar69._12_4_ = fVar61 * fVar18;
        auVar79._0_4_ = fVar6 * fVar55;
        auVar79._4_4_ = fVar6 * fVar13;
        auVar79._8_4_ = fVar6 * fVar16;
        auVar79._12_4_ = fVar6 * fVar19;
        auVar75 = vsubps_avx(auVar79,auVar69);
        auVar80._0_4_ = local_898._0_4_ * fVar61 + fVar6 * auVar64._0_4_ + fVar60 * auVar65._0_4_;
        auVar80._4_4_ = local_898._4_4_ * fVar61 + fVar6 * auVar64._4_4_ + fVar60 * auVar65._4_4_;
        auVar80._8_4_ = local_898._8_4_ * fVar61 + fVar6 * auVar64._8_4_ + fVar60 * auVar65._8_4_;
        auVar80._12_4_ =
             local_898._12_4_ * fVar61 + fVar6 * auVar64._12_4_ + fVar60 * auVar65._12_4_;
        auVar70._8_4_ = 0x80000000;
        auVar70._0_8_ = 0x8000000080000000;
        auVar70._12_4_ = 0x80000000;
        auVar57 = vandps_avx(auVar80,auVar70);
        uVar47 = auVar57._0_4_;
        auVar85._0_4_ =
             (float)(uVar47 ^ (uint)(fVar36 * auVar56._0_4_ +
                                    fVar20 * auVar75._0_4_ + fVar28 * auVar63._0_4_));
        uVar93 = auVar57._4_4_;
        auVar85._4_4_ =
             (float)(uVar93 ^ (uint)(fVar37 * auVar56._4_4_ +
                                    fVar21 * auVar75._4_4_ + fVar29 * auVar63._4_4_));
        uVar94 = auVar57._8_4_;
        auVar85._8_4_ =
             (float)(uVar94 ^ (uint)(fVar38 * auVar56._8_4_ +
                                    fVar22 * auVar75._8_4_ + fVar30 * auVar63._8_4_));
        uVar95 = auVar57._12_4_;
        auVar85._12_4_ =
             (float)(uVar95 ^ (uint)(fVar39 * auVar56._12_4_ +
                                    fVar23 * auVar75._12_4_ + fVar31 * auVar63._12_4_));
        auVar87._0_4_ =
             (float)(uVar47 ^ (uint)(fVar40 * auVar56._0_4_ +
                                    fVar32 * auVar75._0_4_ + auVar63._0_4_ * fVar24));
        auVar87._4_4_ =
             (float)(uVar93 ^ (uint)(fVar41 * auVar56._4_4_ +
                                    fVar33 * auVar75._4_4_ + auVar63._4_4_ * fVar25));
        auVar87._8_4_ =
             (float)(uVar94 ^ (uint)(fVar42 * auVar56._8_4_ +
                                    fVar34 * auVar75._8_4_ + auVar63._8_4_ * fVar26));
        auVar87._12_4_ =
             (float)(uVar95 ^ (uint)(fVar43 * auVar56._12_4_ +
                                    fVar35 * auVar75._12_4_ + auVar63._12_4_ * fVar27));
        auVar63 = ZEXT816(0) << 0x20;
        auVar57 = vcmpps_avx(auVar85,auVar63,5);
        auVar56 = vcmpps_avx(auVar87,auVar63,5);
        auVar57 = vandps_avx(auVar57,auVar56);
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar56 = vandps_avx(auVar80,auVar71);
        auVar63 = vcmpps_avx(auVar63,auVar80,4);
        auVar57 = vandps_avx(auVar57,auVar63);
        auVar59._0_4_ = auVar85._0_4_ + auVar87._0_4_;
        auVar59._4_4_ = auVar85._4_4_ + auVar87._4_4_;
        auVar59._8_4_ = auVar85._8_4_ + auVar87._8_4_;
        auVar59._12_4_ = auVar85._12_4_ + auVar87._12_4_;
        auVar63 = vcmpps_avx(auVar59,auVar56,2);
        auVar75 = auVar63 & auVar57;
        if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar75[0xf] < '\0') {
          auVar57 = vandps_avx(auVar57,auVar63);
          auVar89._0_4_ =
               (float)(uVar47 ^ (uint)(local_898._0_4_ * fVar55 +
                                      fVar90 * auVar64._0_4_ + fVar62 * auVar65._0_4_));
          auVar89._4_4_ =
               (float)(uVar93 ^ (uint)(local_898._4_4_ * fVar13 +
                                      fVar12 * auVar64._4_4_ + fVar11 * auVar65._4_4_));
          auVar89._8_4_ =
               (float)(uVar94 ^ (uint)(local_898._8_4_ * fVar16 +
                                      fVar15 * auVar64._8_4_ + fVar14 * auVar65._8_4_));
          auVar89._12_4_ =
               (float)(uVar95 ^ (uint)(local_898._12_4_ * fVar19 +
                                      fVar18 * auVar64._12_4_ + fVar17 * auVar65._12_4_));
          fVar6 = *(float *)(ray + k * 4 + 0x30);
          fVar60 = auVar56._0_4_;
          auVar72._0_4_ = fVar60 * fVar6;
          fVar61 = auVar56._4_4_;
          auVar72._4_4_ = fVar61 * fVar6;
          fVar62 = auVar56._8_4_;
          auVar72._8_4_ = fVar62 * fVar6;
          fVar90 = auVar56._12_4_;
          auVar72._12_4_ = fVar90 * fVar6;
          auVar63 = vcmpps_avx(auVar72,auVar89,1);
          fVar6 = *(float *)(ray + k * 4 + 0x80);
          auVar81._0_4_ = fVar60 * fVar6;
          auVar81._4_4_ = fVar61 * fVar6;
          auVar81._8_4_ = fVar62 * fVar6;
          auVar81._12_4_ = fVar90 * fVar6;
          auVar75 = vcmpps_avx(auVar89,auVar81,2);
          auVar63 = vandps_avx(auVar63,auVar75);
          auVar57 = vandps_avx(auVar63,auVar57);
          uVar47 = vmovmskps_avx(auVar57);
          if (uVar47 != 0) {
            local_a88 = auVar64._0_8_;
            uStack_a80 = auVar64._8_8_;
            local_888 = local_a88;
            uStack_880 = uStack_a80;
            local_a78 = auVar65._0_8_;
            uStack_a70 = auVar65._8_8_;
            local_878 = local_a78;
            uStack_870 = uStack_a70;
            pSVar8 = context->scene;
            auVar57 = vrcpps_avx(auVar56);
            fVar55 = auVar57._0_4_;
            auVar73._0_4_ = fVar60 * fVar55;
            fVar60 = auVar57._4_4_;
            auVar73._4_4_ = fVar61 * fVar60;
            fVar61 = auVar57._8_4_;
            auVar73._8_4_ = fVar62 * fVar61;
            fVar62 = auVar57._12_4_;
            auVar73._12_4_ = fVar90 * fVar62;
            auVar82._8_4_ = 0x3f800000;
            auVar82._0_8_ = 0x3f8000003f800000;
            auVar82._12_4_ = 0x3f800000;
            auVar57 = vsubps_avx(auVar82,auVar73);
            fVar55 = fVar55 + fVar55 * auVar57._0_4_;
            fVar60 = fVar60 + fVar60 * auVar57._4_4_;
            fVar61 = fVar61 + fVar61 * auVar57._8_4_;
            fVar62 = fVar62 + fVar62 * auVar57._12_4_;
            local_8a8[0] = fVar55 * auVar89._0_4_;
            local_8a8[1] = fVar60 * auVar89._4_4_;
            local_8a8[2] = fVar61 * auVar89._8_4_;
            local_8a8[3] = fVar62 * auVar89._12_4_;
            local_8c8._0_4_ = fVar55 * auVar85._0_4_;
            local_8c8._4_4_ = fVar60 * auVar85._4_4_;
            local_8c8._8_4_ = fVar61 * auVar85._8_4_;
            local_8c8._12_4_ = fVar62 * auVar85._12_4_;
            local_8b8._0_4_ = fVar55 * auVar87._0_4_;
            local_8b8._4_4_ = fVar60 * auVar87._4_4_;
            local_8b8._8_4_ = fVar61 * auVar87._8_4_;
            local_8b8._12_4_ = fVar62 * auVar87._12_4_;
            uVar44 = (ulong)(uVar47 & 0xff);
            do {
              uVar50 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar47 = *(uint *)(lVar48 + uVar52 + 0x90 + uVar50 * 4);
              pGVar9 = (pSVar8->geometries).items[uVar47].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0031092f:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar54;
                }
                local_838 = *(undefined4 *)(local_8c8 + uVar50 * 4);
                uVar2 = *(undefined4 *)(local_8b8 + uVar50 * 4);
                local_828._4_4_ = uVar2;
                local_828._0_4_ = uVar2;
                local_828._8_4_ = uVar2;
                local_828._12_4_ = uVar2;
                *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar50];
                args.context = context->user;
                local_808 = vshufps_avx(ZEXT416(uVar47),ZEXT416(uVar47),0);
                uVar2 = *(undefined4 *)(lVar48 + uVar52 + 0xa0 + uVar50 * 4);
                local_818._4_4_ = uVar2;
                local_818._0_4_ = uVar2;
                local_818._8_4_ = uVar2;
                local_818._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_898 + uVar50 * 4);
                uVar7 = *(undefined4 *)((long)&local_888 + uVar50 * 4);
                local_858._4_4_ = uVar7;
                local_858._0_4_ = uVar7;
                local_858._8_4_ = uVar7;
                local_858._12_4_ = uVar7;
                uVar7 = *(undefined4 *)((long)&local_878 + uVar50 * 4);
                local_848._4_4_ = uVar7;
                local_848._0_4_ = uVar7;
                local_848._8_4_ = uVar7;
                local_848._12_4_ = uVar7;
                local_868[0] = (RTCHitN)(char)uVar2;
                local_868[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_868[4] = (RTCHitN)(char)uVar2;
                local_868[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_868[8] = (RTCHitN)(char)uVar2;
                local_868[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_868[0xc] = (RTCHitN)(char)uVar2;
                local_868[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                vcmpps_avx(ZEXT1632(local_808),ZEXT1632(local_808),0xf);
                uStack_7f4 = (args.context)->instID[0];
                local_7f8 = uStack_7f4;
                uStack_7f0 = uStack_7f4;
                uStack_7ec = uStack_7f4;
                uStack_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = uStack_7e8;
                uStack_7e0 = uStack_7e8;
                uStack_7dc = uStack_7e8;
                local_a28 = *local_9f0;
                args.valid = (int *)local_a28;
                args.geometryUserPtr = pGVar9->userPtr;
                args.hit = local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->occlusionFilterN)(&args);
                }
                if (local_a28 == (undefined1  [16])0x0) {
                  auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar57 = auVar57 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&args);
                  }
                  auVar56 = vpcmpeqd_avx(local_a28,_DAT_01f7aa10);
                  auVar57 = auVar56 ^ _DAT_01f7ae20;
                  auVar83._8_4_ = 0xff800000;
                  auVar83._0_8_ = 0xff800000ff800000;
                  auVar83._12_4_ = 0xff800000;
                  auVar56 = vblendvps_avx(auVar83,*(undefined1 (*) [16])(args.ray + 0x80),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar56;
                }
                auVar74._8_8_ = 0x100000001;
                auVar74._0_8_ = 0x100000001;
                if ((auVar74 & auVar57) != (undefined1  [16])0x0) goto LAB_0031092f;
                *(float *)(ray + k * 4 + 0x80) = fVar6;
              }
              uVar44 = uVar44 ^ 1L << (uVar50 & 0x3f);
            } while (uVar44 != 0);
          }
        }
        local_a10 = local_a10 + 1;
      } while (local_a10 != local_a08);
    }
    bVar54 = local_9f8 != stack;
joined_r0x003102fb:
    if (!bVar54) {
      return bVar54;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }